

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O0

void __thiscall
duckdb::ReservoirSample::WeightedMerge(ReservoirSample *this,ReservoirSample *other_sample)

{
  double dVar1;
  unsigned_long a;
  idx_t iVar2;
  idx_t iVar3;
  pointer pBVar4;
  unsigned_long b;
  DataChunk *pDVar5;
  size_type sVar6;
  ReservoirSample *in_RDI;
  pair<double,_unsigned_long> pVar7;
  value_type replacement_index;
  idx_t index_for_new_pair;
  pair<double,_unsigned_long> other_top;
  idx_t i;
  idx_t chunk_offset;
  SelectionVector sel_other;
  pair<double,_unsigned_long> top_this;
  double min_weight_other;
  double min_weight_this;
  idx_t i_1;
  vector<unsigned_long,_true> this_indexes_to_replace;
  idx_t num_samples_to_keep;
  idx_t total_samples_seen;
  idx_t total_samples;
  BlockingSample *in_stack_fffffffffffffe48;
  BaseReservoirSampling *in_stack_fffffffffffffe50;
  value_type_conflict1 *in_stack_fffffffffffffe58;
  SelectionVector *in_stack_fffffffffffffe60;
  value_type *in_stack_fffffffffffffe68;
  SelectionVector *in_stack_fffffffffffffe70;
  ReservoirSample *in_stack_fffffffffffffe98;
  ReservoirSample *in_stack_fffffffffffffeb0;
  unsigned_long in_stack_fffffffffffffef0;
  double in_stack_fffffffffffffef8;
  pointer in_stack_ffffffffffffff00;
  pointer in_stack_ffffffffffffff08;
  pointer in_stack_ffffffffffffff10;
  ulong local_a0;
  unsigned_long local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  unsigned_long local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  
  iVar2 = GetActiveSampleCount(in_stack_fffffffffffffe98);
  iVar3 = GetActiveSampleCount(in_stack_fffffffffffffe98);
  local_18 = iVar2 + iVar3;
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)in_stack_fffffffffffffe50);
  iVar2 = pBVar4->num_entries_seen_total;
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)in_stack_fffffffffffffe50);
  a = local_18;
  local_20 = iVar2 + pBVar4->num_entries_seen_total;
  b = MinValue<unsigned_long>(in_RDI->sample_count,local_20);
  local_28 = MinValue<unsigned_long>(a,b);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x18fdf9a);
  pVar7.second = in_stack_fffffffffffffef0;
  pVar7.first = in_stack_fffffffffffffef8;
  for (local_48 = local_28; local_48 < local_18; local_48 = local_48 + 1) {
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                           *)in_stack_fffffffffffffe50);
    dVar1 = pBVar4->min_weight_threshold;
    in_stack_ffffffffffffff10 =
         unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
         ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                       *)in_stack_fffffffffffffe50);
    if (dVar1 <= in_stack_ffffffffffffff10->min_weight_threshold) {
      pVar7 = BlockingSample::PopFromWeightQueue(in_stack_fffffffffffffe48);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
      ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                    *)in_stack_fffffffffffffe50);
      BaseReservoirSampling::UpdateMinWeightThreshold(in_stack_fffffffffffffe50);
    }
    else {
      in_stack_ffffffffffffff08 =
           unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)in_stack_fffffffffffffe50);
      ::std::
      priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
      ::pop((priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
             *)in_stack_fffffffffffffe60);
      in_stack_ffffffffffffff00 =
           unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)in_stack_fffffffffffffe50);
      BaseReservoirSampling::UpdateMinWeightThreshold(in_stack_fffffffffffffe50);
    }
  }
  BlockingSample::GetPriorityQueueSize((BlockingSample *)0x18fe159);
  SelectionVector::SelectionVector(in_stack_fffffffffffffe70,(idx_t)in_stack_fffffffffffffe68);
  local_a0 = 0;
  while( true ) {
    iVar2 = BlockingSample::GetPriorityQueueSize((BlockingSample *)0x18fe19f);
    if (iVar2 == 0) break;
    BlockingSample::PopFromWeightQueue(in_stack_fffffffffffffe48);
    pDVar5 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              ::operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                            *)in_stack_fffffffffffffe50)->chunk;
    in_stack_fffffffffffffeb0 = (ReservoirSample *)DataChunk::size(pDVar5);
    SelectionVector::set_index
              (in_stack_fffffffffffffe60,(idx_t)in_stack_fffffffffffffe58,
               (idx_t)in_stack_fffffffffffffe50);
    sVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_40);
    if (local_a0 < sVar6) {
      vector<unsigned_long,_true>::operator[]
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe50,
                 (size_type)in_stack_fffffffffffffe48);
      SelectionVector::set_index
                (in_stack_fffffffffffffe60,(idx_t)in_stack_fffffffffffffe58,
                 (idx_t)in_stack_fffffffffffffe50);
    }
    else {
      SelectionVector::set_index
                (in_stack_fffffffffffffe60,(idx_t)in_stack_fffffffffffffe58,
                 (idx_t)in_stack_fffffffffffffe50);
      in_RDI->sel_size = in_RDI->sel_size + 1;
    }
    unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
    ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                  *)in_stack_fffffffffffffe50);
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::push((priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
            *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_a0 = local_a0 + 1;
  }
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                *)in_stack_fffffffffffffe50);
  BaseReservoirSampling::UpdateMinWeightThreshold(in_stack_fffffffffffffe50);
  iVar3 = GetTuplesSeen((ReservoirSample *)0x18fe3e9);
  iVar2 = GetTuplesSeen((ReservoirSample *)0x18fe3fd);
  iVar3 = iVar3 + iVar2;
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)in_stack_fffffffffffffe50);
  pBVar4->num_entries_seen_total = iVar3;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::operator->
            ((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              *)in_stack_fffffffffffffe50);
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::operator->
            ((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              *)in_stack_fffffffffffffe50);
  UpdateSampleAppend((ReservoirSample *)in_stack_ffffffffffffff10,
                     (DataChunk *)in_stack_ffffffffffffff08,(DataChunk *)in_stack_ffffffffffffff00,
                     (SelectionVector *)pVar7.first,pVar7.second);
  pDVar5 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
            operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                        *)in_stack_fffffffffffffe50)->chunk;
  iVar2 = DataChunk::size(pDVar5);
  if (0x3800 < iVar2) {
    Vacuum(in_stack_fffffffffffffeb0);
  }
  Verify(in_RDI);
  SelectionVector::~SelectionVector((SelectionVector *)0x18fe500);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x18fe50d);
  return;
}

Assistant:

void ReservoirSample::WeightedMerge(ReservoirSample &other_sample) {
	D_ASSERT(GetSamplingState() == SamplingState::RESERVOIR);
	D_ASSERT(other_sample.GetSamplingState() == SamplingState::RESERVOIR);

	// Find out how many samples we want to keep.
	idx_t total_samples = GetActiveSampleCount() + other_sample.GetActiveSampleCount();
	idx_t total_samples_seen =
	    base_reservoir_sample->num_entries_seen_total + other_sample.base_reservoir_sample->num_entries_seen_total;
	idx_t num_samples_to_keep = MinValue<idx_t>(total_samples, MinValue<idx_t>(sample_count, total_samples_seen));

	D_ASSERT(GetActiveSampleCount() <= num_samples_to_keep);
	D_ASSERT(total_samples <= FIXED_SAMPLE_SIZE * 2);

	// pop from base base_reservoir weights until there are num_samples_to_keep left.
	vector<idx_t> this_indexes_to_replace;
	for (idx_t i = num_samples_to_keep; i < total_samples; i++) {
		auto min_weight_this = base_reservoir_sample->min_weight_threshold;
		auto min_weight_other = other_sample.base_reservoir_sample->min_weight_threshold;
		// min weight threshol is always positive
		if (min_weight_this > min_weight_other) {
			// pop from other
			other_sample.base_reservoir_sample->reservoir_weights.pop();
			other_sample.base_reservoir_sample->UpdateMinWeightThreshold();
		} else {
			auto top_this = PopFromWeightQueue();
			this_indexes_to_replace.push_back(top_this.second);
			base_reservoir_sample->UpdateMinWeightThreshold();
		}
	}

	D_ASSERT(other_sample.GetPriorityQueueSize() + GetPriorityQueueSize() <= FIXED_SAMPLE_SIZE);
	D_ASSERT(other_sample.GetPriorityQueueSize() + GetPriorityQueueSize() == num_samples_to_keep);
	D_ASSERT(other_sample.reservoir_chunk->chunk.GetTypes() == reservoir_chunk->chunk.GetTypes());

	// Prepare a selection vector to copy data from the other sample chunk to this sample chunk
	SelectionVector sel_other(other_sample.GetPriorityQueueSize());
	D_ASSERT(GetPriorityQueueSize() <= num_samples_to_keep);
	D_ASSERT(other_sample.GetPriorityQueueSize() >= this_indexes_to_replace.size());
	idx_t chunk_offset = 0;

	// Now push weights from other.base_reservoir_sample to this
	// Depending on how many sample values "this" has, we either need to add to the selection vector
	// Or replace values in "this'" selection vector
	idx_t i = 0;
	while (other_sample.GetPriorityQueueSize() > 0) {
		auto other_top = other_sample.PopFromWeightQueue();
		idx_t index_for_new_pair = chunk_offset + reservoir_chunk->chunk.size();

		// update the sel used to copy values from other to this
		sel_other.set_index(chunk_offset, other_top.second);
		if (i < this_indexes_to_replace.size()) {
			auto replacement_index = this_indexes_to_replace[i];
			sel.set_index(replacement_index, index_for_new_pair);
			other_top.second = replacement_index;
		} else {
			sel.set_index(sel_size, index_for_new_pair);
			other_top.second = sel_size;
			sel_size += 1;
		}

		// make sure that the sample indexes are (this.sample_chunk.size() + chunk_offfset)
		base_reservoir_sample->reservoir_weights.push(other_top);
		chunk_offset += 1;
		i += 1;
	}

	D_ASSERT(GetPriorityQueueSize() == num_samples_to_keep);

	base_reservoir_sample->UpdateMinWeightThreshold();
	D_ASSERT(base_reservoir_sample->min_weight_threshold > 0);
	base_reservoir_sample->num_entries_seen_total = GetTuplesSeen() + other_sample.GetTuplesSeen();

	UpdateSampleAppend(reservoir_chunk->chunk, other_sample.reservoir_chunk->chunk, sel_other, chunk_offset);
	if (reservoir_chunk->chunk.size() > FIXED_SAMPLE_SIZE * (FIXED_SAMPLE_SIZE_MULTIPLIER - 3)) {
		Vacuum();
	}

	Verify();
}